

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O0

int FindLargestSplittableBlock
              (size_t lz77size,uchar *done,size_t *splitpoints,size_t npoints,size_t *lstart,
              size_t *lend)

{
  size_t local_68;
  size_t local_60;
  size_t end;
  size_t start;
  size_t i;
  int found;
  size_t longest;
  size_t *lend_local;
  size_t *lstart_local;
  size_t npoints_local;
  size_t *splitpoints_local;
  uchar *done_local;
  size_t lz77size_local;
  
  longest = 0;
  found = 0;
  for (i = 0; i <= npoints; i = i + 1) {
    if (i == 0) {
      local_60 = 0;
    }
    else {
      local_60 = splitpoints[i - 1];
    }
    if (i == npoints) {
      local_68 = lz77size - 1;
    }
    else {
      local_68 = splitpoints[i];
    }
    if ((done[local_60] == '\0') && (longest < local_68 - local_60)) {
      *lstart = local_60;
      *lend = local_68;
      found = 1;
      longest = local_68 - local_60;
    }
  }
  return found;
}

Assistant:

static int FindLargestSplittableBlock(
    size_t lz77size, const unsigned char* done,
    const size_t* splitpoints, size_t npoints,
    size_t* lstart, size_t* lend) {
  size_t longest = 0;
  int found = 0;
  size_t i;
  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? 0 : splitpoints[i - 1];
    size_t end = i == npoints ? lz77size - 1 : splitpoints[i];
    if (!done[start] && end - start > longest) {
      *lstart = start;
      *lend = end;
      found = 1;
      longest = end - start;
    }
  }
  return found;
}